

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O2

S2Point * S2LatLngRect::GetBisectorIntersection
                    (S2Point *__return_storage_ptr__,R1Interval *lat,double lng)

{
  int iVar1;
  double dVar2;
  double dVar3;
  S2LatLng local_38;
  S2Point local_28;
  
  local_38.coords_.c_[1] = ABS(lng);
  dVar2 = ((lat->bounds_).c_[0] + (lat->bounds_).c_[1]) * 0.5;
  dVar3 = -dVar2;
  local_38.coords_.c_[0] =
       (double)(~-(ulong)(dVar2 < dVar3) & (ulong)dVar2 | (ulong)dVar3 & -(ulong)(dVar2 < dVar3)) +
       -1.5707963267948966;
  if (dVar2 < dVar3) {
    local_38.coords_.c_[1] = local_38.coords_.c_[1] + -3.141592653589793;
  }
  if (GetBisectorIntersection(R1Interval_const&,double)::ortho_lng == '\0') {
    iVar1 = __cxa_guard_acquire(&GetBisectorIntersection(R1Interval_const&,double)::ortho_lng);
    if (iVar1 != 0) {
      GetBisectorIntersection::ortho_lng.c_[0] = 0.0;
      GetBisectorIntersection::ortho_lng.c_[1] = -1.0;
      GetBisectorIntersection::ortho_lng.c_[2] = 0.0;
      __cxa_guard_release(&GetBisectorIntersection(R1Interval_const&,double)::ortho_lng);
    }
  }
  S2LatLng::ToPoint(&local_28,&local_38);
  S2::RobustCrossProd(__return_storage_ptr__,&GetBisectorIntersection::ortho_lng,&local_28);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2LatLngRect::GetBisectorIntersection(const R1Interval& lat,
                                              double lng) {
  lng = fabs(lng);
  double lat_center = lat.GetCenter();
  // A vector orthogonal to the bisector of the given longitudinal edge.
  S2LatLng ortho_bisector;
  if (lat_center >= 0) {
    ortho_bisector = S2LatLng::FromRadians(lat_center - M_PI_2, lng);
  } else {
    ortho_bisector = S2LatLng::FromRadians(-lat_center - M_PI_2, lng - M_PI);
  }
  // A vector orthogonal to longitude 0.
  static const S2Point ortho_lng = S2Point(0, -1, 0);
  return S2::RobustCrossProd(ortho_lng, ortho_bisector.ToPoint());
}